

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O2

void av1_collect_neighbors_ref_counts(MACROBLOCKD *xd)

{
  _Bool _Var1;
  MB_MODE_INFO *pMVar2;
  
  xd->neighbors_ref_counts[0] = '\0';
  xd->neighbors_ref_counts[1] = '\0';
  xd->neighbors_ref_counts[2] = '\0';
  xd->neighbors_ref_counts[3] = '\0';
  xd->neighbors_ref_counts[4] = '\0';
  xd->neighbors_ref_counts[5] = '\0';
  xd->neighbors_ref_counts[6] = '\0';
  xd->neighbors_ref_counts[7] = '\0';
  _Var1 = xd->left_available;
  if (xd->up_available == true) {
    pMVar2 = xd->above_mbmi;
    if ((pMVar2->field_0xa7 & 0x80) != 0 || '\0' < pMVar2->ref_frame[0]) {
      xd->neighbors_ref_counts[pMVar2->ref_frame[0]] =
           xd->neighbors_ref_counts[pMVar2->ref_frame[0]] + '\x01';
      if (0 < (long)pMVar2->ref_frame[1]) {
        xd->neighbors_ref_counts[pMVar2->ref_frame[1]] =
             xd->neighbors_ref_counts[pMVar2->ref_frame[1]] + '\x01';
      }
    }
  }
  if (_Var1 != false) {
    pMVar2 = xd->left_mbmi;
    if ((pMVar2->field_0xa7 & 0x80) != 0 || '\0' < pMVar2->ref_frame[0]) {
      xd->neighbors_ref_counts[pMVar2->ref_frame[0]] =
           xd->neighbors_ref_counts[pMVar2->ref_frame[0]] + '\x01';
      if (0 < (long)pMVar2->ref_frame[1]) {
        xd->neighbors_ref_counts[pMVar2->ref_frame[1]] =
             xd->neighbors_ref_counts[pMVar2->ref_frame[1]] + '\x01';
      }
    }
  }
  return;
}

Assistant:

static inline void av1_collect_neighbors_ref_counts(MACROBLOCKD *const xd) {
  av1_zero(xd->neighbors_ref_counts);

  uint8_t *const ref_counts = xd->neighbors_ref_counts;

  const MB_MODE_INFO *const above_mbmi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mbmi = xd->left_mbmi;
  const int above_in_image = xd->up_available;
  const int left_in_image = xd->left_available;

  // Above neighbor
  if (above_in_image && is_inter_block(above_mbmi)) {
    ref_counts[above_mbmi->ref_frame[0]]++;
    if (has_second_ref(above_mbmi)) {
      ref_counts[above_mbmi->ref_frame[1]]++;
    }
  }

  // Left neighbor
  if (left_in_image && is_inter_block(left_mbmi)) {
    ref_counts[left_mbmi->ref_frame[0]]++;
    if (has_second_ref(left_mbmi)) {
      ref_counts[left_mbmi->ref_frame[1]]++;
    }
  }
}